

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

void __thiscall helics::Federate::verifyCore(Federate *this)

{
  int iVar1;
  HelicsException *this_00;
  RegistrationFailure *this_01;
  string_view message_00;
  string_view message_01;
  string message;
  char *local_28;
  size_t local_20;
  
  iVar1 = (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_Core[7])();
  if ((char)iVar1 == '\0') {
    (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Core[6])();
    iVar1 = (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_Core[7])();
    if ((char)iVar1 == '\0') {
      iVar1 = (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_Core[9])();
      if ((char)iVar1 != '\0') {
        (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_Core[0x11])(&local_28);
        (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_Core[8])();
        this_00 = (HelicsException *)__cxa_allocate_exception(0x28);
        message_00._M_str = local_28;
        message_00._M_len = local_20;
        HelicsException::HelicsException(this_00,message_00);
        *(undefined ***)this_00 = &PTR__HelicsException_00551820;
        __cxa_throw(this_00,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
      }
      (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_Core[8])();
      this_01 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
      message_01._M_str = "Unable to connect to broker->unable to register federate";
      message_01._M_len = 0x38;
      RegistrationFailure::RegistrationFailure(this_01,message_01);
      __cxa_throw(this_01,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
  }
  return;
}

Assistant:

void Federate::verifyCore()
{
    /** make sure the core is connected */
    if (!coreObject->isConnected()) {
        coreObject->connect();
        if (!coreObject->isConnected()) {
            if (coreObject->hasError()) {
                auto message = coreObject->getErrorMessage();
                coreObject->disconnect();
                throw(RegistrationFailure(message));
            }
            coreObject->disconnect();
            throw(RegistrationFailure("Unable to connect to broker->unable to register federate"));
        }
    }
}